

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c3dfile.cc
# Opt level: O0

FloatMarkerData * __thiscall
C3DFile::getMarkerTrajectories
          (FloatMarkerData *__return_storage_ptr__,C3DFile *this,char *point_name_str)

{
  bool bVar1;
  ostream *poVar2;
  pointer ppVar3;
  reference pvVar4;
  bool local_101;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short>_>
  local_98;
  ushort local_8a;
  iterator iStack_88;
  Sint16 index;
  _Self local_80;
  string local_78 [55];
  allocator<char> local_41;
  undefined1 local_40 [8];
  string marker_name;
  char *point_name_str_local;
  C3DFile *this_local;
  
  marker_name.field_2._8_8_ = point_name_str;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_40,point_name_str,&local_41);
  std::allocator<char>::~allocator(&local_41);
  std::__cxx11::string::find_last_not_of(local_40,0x127aba);
  std::__cxx11::string::substr((ulong)local_78,(ulong)local_40);
  std::__cxx11::string::operator=((string *)local_40,local_78);
  std::__cxx11::string::~string(local_78);
  local_80._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short>_>_>
       ::find(&this->label_point_map,(key_type *)local_40);
  iStack_88 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short>_>_>
              ::end(&this->label_point_map);
  bVar1 = std::operator==(&local_80,&stack0xffffffffffffff78);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Error: could not find marker with name \'");
    poVar2 = std::operator<<(poVar2,(string *)local_40);
    poVar2 = std::operator<<(poVar2,"\'!");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    abort();
  }
  local_98._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short>_>_>
       ::find(&this->label_point_map,(key_type *)local_40);
  ppVar3 = std::
           _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short>_>
           ::operator->(&local_98);
  local_8a = ppVar3->second;
  local_101 = 0xfe < local_8a;
  if (local_101) {
    __assert_fail("index >= 0 && index < 255",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/ORB-HD[P]c3dfile/src/c3dfile.cc"
                  ,0x30,"FloatMarkerData C3DFile::getMarkerTrajectories(const char *)");
  }
  pvVar4 = std::vector<FloatMarkerData,_std::allocator<FloatMarkerData>_>::operator[]
                     (&this->float_point_data,(long)(short)local_8a);
  FloatMarkerData::FloatMarkerData(__return_storage_ptr__,pvVar4);
  std::__cxx11::string::~string((string *)local_40);
  return __return_storage_ptr__;
}

Assistant:

FloatMarkerData C3DFile::getMarkerTrajectories (const char* point_name_str) {
	std::string marker_name(point_name_str);
	
	marker_name = marker_name.substr(0, marker_name.find_last_not_of(" ") + 1);

	if (label_point_map.find(marker_name) == label_point_map.end()) {
		cerr << "Error: could not find marker with name '" << marker_name << "'!" << endl;
		abort();
	}

	Sint16 index = label_point_map.find(marker_name)->second;

	assert (index >= 0 && index < 255);

	return float_point_data[index];
}